

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guardedTests.cpp
# Opt level: O1

void __thiscall
cow_guarded_cow_guarded_2_Test::~cow_guarded_cow_guarded_2_Test
          (cow_guarded_cow_guarded_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(cow_guarded, cow_guarded_2)
{
    cow_guarded<int, std::timed_mutex> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th3([&data]() {
        int last_val = 0;
        for (int i = 0; i < 100000; ++i) {
            while (last_val != 200000) {
                auto data_handle = data.lock_shared();
                EXPECT_TRUE(last_val <= *data_handle);
                last_val = *data_handle;
            }
        }
    });

    th1.join();
    th2.join();
    th3.join();

    auto data_handle = data.lock_shared();

    EXPECT_EQ(*data_handle, 200000);
}